

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeModel::beginRemoveItems(QTreeModel *this,QTreeWidgetItem *parent,int row,int count)

{
  pointer ppQVar1;
  ulong uVar2;
  ulong uVar3;
  QTreeWidgetItem *itemToBeRemoved;
  ulong uVar4;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_38;
  
  local_38 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  index((QTreeModel *)&stack0xffffffffffffffb0,(char *)this,(int)parent);
  QAbstractItemModel::beginRemoveRows
            ((QModelIndex *)this,(int)(QTreeModel *)&stack0xffffffffffffffb0,row);
  if (parent == (QTreeWidgetItem *)0x0) {
    parent = this->rootItem;
  }
  if ((this->iterators).d.size != 0) {
    uVar4 = 0;
    do {
      uVar2 = (ulong)(uint)count;
      uVar3 = (long)row;
      if (0 < count) {
        do {
          if (((long)uVar3 < 0) || ((ulong)(parent->children).d.size <= uVar3)) {
            itemToBeRemoved = (QTreeWidgetItem *)0x0;
          }
          else {
            QTreeWidgetItem::executePendingSort(parent);
            itemToBeRemoved = (parent->children).d.ptr[uVar3];
          }
          ppQVar1 = QList<QTreeWidgetItemIterator_*>::data(&this->iterators);
          QTreeWidgetItemIteratorPrivate::ensureValidIterator
                    ((ppQVar1[uVar4]->d_ptr).d,itemToBeRemoved);
          uVar3 = uVar3 + 1;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(this->iterators).d.size);
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeModel::beginRemoveItems(QTreeWidgetItem *parent, int row, int count)
{
    Q_ASSERT(row >= 0);
    Q_ASSERT(count > 0);
    beginRemoveRows(index(parent, 0), row, row + count - 1);
    if (!parent)
        parent = rootItem;
    // now update the iterators
    for (int i = 0; i < iterators.size(); ++i) {
        for (int j = 0; j < count; j++) {
            QTreeWidgetItem *c = parent->child(row + j);
            iterators[i]->d_func()->ensureValidIterator(c);
        }
    }
}